

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O0

void idx2::Clone(buffer *Src,buffer *Dst,allocator *Alloc)

{
  allocator *Alloc_local;
  buffer *Dst_local;
  buffer *Src_local;
  
  if ((Dst->Data != (byte *)0x0) && (Dst->Bytes != Src->Bytes)) {
    DeallocBuf(Dst);
  }
  if ((Dst->Data == (byte *)0x0) && (Dst->Bytes == 0)) {
    (**Alloc->_vptr_allocator)(Alloc,Dst,Src->Bytes);
  }
  MemCopy(Src,Dst);
  return;
}

Assistant:

void
Clone(const buffer& Src, buffer* Dst, allocator* Alloc)
{
  if (Dst->Data && Dst->Bytes != Src.Bytes)
    DeallocBuf(Dst);
  if (!Dst->Data && Dst->Bytes == 0)
    Alloc->Alloc(Dst, Src.Bytes);
  MemCopy(Src, Dst);
}